

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

ptr<resp_msg> __thiscall nuraft::raft_server::handle_rm_srv_req(raft_server *this,req_msg *req)

{
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *__args_3;
  byte bVar1;
  pointer psVar2;
  _func_int **pp_Var3;
  peer *this_00;
  bool bVar4;
  int iVar5;
  buffer *pbVar6;
  size_t sVar7;
  iterator iVar8;
  long lVar9;
  _func_int *p_Var10;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  enable_shared_from_this<nuraft::raft_server> *this_01;
  msg_type *pmVar12;
  shared_ptr<nuraft::resp_msg> sVar13;
  ptr<resp_msg> pVar14;
  string local_a8;
  int32 srv_id;
  ptr<peer> p;
  undefined4 local_70;
  int local_6c;
  ptr<req_msg> leave_req;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_50;
  _func_int **local_40;
  unsigned_long local_38;
  
  local_a8._M_dataplus._M_p = (pointer)req[9].super_msg_base._vptr_msg_base[1];
  p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 9;
  __args_3 = &req->log_entries_;
  sVar13 = std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,std::atomic<int>&>
                     ((unsigned_long *)this,(msg_type *)&local_a8,(int *)&p,(atomic<int> *)__args_3)
  ;
  _Var11 = sVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (*(long *)(in_RDX + 0x40) - (long)*(undefined8 **)(in_RDX + 0x38) == 0x10) {
    pbVar6 = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
    sVar7 = buffer::size(pbVar6);
    _Var11._M_pi = extraout_RDX;
    if (sVar7 == 4) {
      if ((*(int *)&req[8].log_entries_.
                    super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) &&
         (((ulong)req[3].super_msg_base._vptr_msg_base & 1) == 0)) {
        check_srv_to_leave_timeout((raft_server *)req);
        _Var11._M_pi = extraout_RDX_04;
        if (req[0xb].log_entries_.
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
          pmVar12 = &req[6].super_msg_base.type_;
          bVar4 = false;
          do {
            pmVar12 = *(msg_type **)pmVar12;
            if (pmVar12 == (msg_type *)0x0) {
              if (*(char *)((long)&req[2].log_entries_.
                                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) == '\x01'
                 ) {
                psVar2 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if (psVar2 != (pointer)0x0) {
                  iVar5 = (*(code *)(psVar2->
                                    super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr[1].buff_.
                                    super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)();
                  _Var11._M_pi = extraout_RDX_08;
                  if (2 < iVar5) {
                    psVar2 = req[9].log_entries_.
                             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    msg_if_given_abi_cxx11_(&local_a8,"previous config has not committed yet");
                    (*(code *)(psVar2->
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr[1].buff_.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)
                              (psVar2,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                               ,"handle_rm_srv_req",0x192,&local_a8);
                    std::__cxx11::string::~string((string *)&local_a8);
                    _Var11._M_pi = extraout_RDX_09;
                  }
                }
                *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffa;
                goto LAB_00136f96;
              }
              pbVar6 = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
              srv_id = buffer::get_int(pbVar6);
              if (srv_id == *(int *)&(__args_3->
                                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start) {
                psVar2 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                _Var11._M_pi = extraout_RDX_10;
                if (psVar2 != (pointer)0x0) {
                  iVar5 = (*(code *)(psVar2->
                                    super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr[1].buff_.
                                    super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)();
                  _Var11._M_pi = extraout_RDX_11;
                  if (2 < iVar5) {
                    psVar2 = req[9].log_entries_.
                             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    msg_if_given_abi_cxx11_(&local_a8,"cannot request to remove leader");
                    (*(code *)(psVar2->
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr[1].buff_.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)
                              (psVar2,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                               ,"handle_rm_srv_req",0x199,&local_a8);
                    std::__cxx11::string::~string((string *)&local_a8);
                    _Var11._M_pi = extraout_RDX_12;
                  }
                }
                *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffff7;
                goto LAB_00136f96;
              }
              iVar8 = std::
                      _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              *)(req + 6),&srv_id);
              if (iVar8.
                  super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                psVar2 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                _Var11._M_pi = extraout_RDX_13;
                if (psVar2 != (pointer)0x0) {
                  iVar5 = (*(code *)(psVar2->
                                    super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr[1].buff_.
                                    super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)();
                  _Var11._M_pi = extraout_RDX_14;
                  if (2 < iVar5) {
                    psVar2 = req[9].log_entries_.
                             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    msg_if_given_abi_cxx11_
                              (&local_a8,"server %d does not exist",(ulong)(uint)srv_id);
                    (*(code *)(psVar2->
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr[1].buff_.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)
                              (psVar2,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                               ,"handle_rm_srv_req",0x1a0,&local_a8);
                    std::__cxx11::string::~string((string *)&local_a8);
                    _Var11._M_pi = extraout_RDX_15;
                  }
                }
                *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffff8;
                goto LAB_00136f96;
              }
              std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                         (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                         ((long)iVar8.
                                super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                ._M_cur + 0x10));
              local_a8._M_dataplus._M_p = (pointer)req[9].super_msg_base._vptr_msg_base[1];
              local_70 = 0;
              local_6c = 0xe;
              lVar9 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
              local_38 = lVar9 - 1;
              local_40 = req[2].super_msg_base._vptr_msg_base;
              std::
              make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int&,int,unsigned_long,unsigned_long>
                        ((unsigned_long *)&leave_req,(msg_type *)&local_a8,&local_6c,(int *)__args_3
                         ,&srv_id,(unsigned_long *)&local_70,&local_38);
              LOCK();
              (((peer *)CONCAT44(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._4_4_,
                                 p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._0_4_))->leave_requested_)._M_base._M_i = true;
              UNLOCK();
              bVar4 = peer::make_busy((peer *)CONCAT44(p.
                                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  p.
                                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_));
              this_00 = (peer *)CONCAT44(p.
                                         super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._4_4_,
                                         p.
                                         super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._0_4_);
              if (bVar4) {
                std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_50,&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                          );
                peer::send_req(this_00,(ptr<peer> *)&local_50,&leave_req,
                               (rpc_handler *)&req[0x12].super_msg_base.term_);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_50._M_refcount);
                psVar2 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if (psVar2 != (pointer)0x0) {
                  iVar5 = (*(code *)(psVar2->
                                    super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr[1].buff_.
                                    super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)();
                  if (3 < iVar5) {
                    psVar2 = req[9].log_entries_.
                             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    msg_if_given_abi_cxx11_
                              (&local_a8,"sent leave request to peer %d",
                               (ulong)**(uint **)CONCAT44(p.
                                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  p.
                                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_));
                    (*(code *)(psVar2->
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr[1].buff_.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)
                              (psVar2,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                               ,"handle_rm_srv_req",0x1b4,&local_a8);
LAB_0013748a:
                    std::__cxx11::string::~string((string *)&local_a8);
                  }
                }
              }
              else {
                peer::set_rsv_msg(this_00,&leave_req,(rpc_handler *)&req[0x12].super_msg_base.term_)
                ;
                psVar2 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if (psVar2 != (pointer)0x0) {
                  iVar5 = (*(code *)(psVar2->
                                    super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr[1].buff_.
                                    super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)();
                  if (3 < iVar5) {
                    psVar2 = req[9].log_entries_.
                             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    msg_if_given_abi_cxx11_
                              (&local_a8,"peer %d is currently busy, keep the message",
                               (ulong)**(uint **)CONCAT44(p.
                                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  p.
                                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_));
                    (*(code *)(psVar2->
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr[1].buff_.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)
                              (psVar2,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                               ,"handle_rm_srv_req",0x1b7,&local_a8);
                    goto LAB_0013748a;
                  }
                }
              }
              pp_Var3 = this->_vptr_raft_server;
              p_Var10 = (_func_int *)(**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))()
              ;
              pp_Var3[4] = p_Var10;
              *(undefined1 *)(pp_Var3 + 6) = 1;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&leave_req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              this_01 = (enable_shared_from_this<nuraft::raft_server> *)
                        &p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
              goto LAB_001374bc;
            }
            std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(pmVar12 + 4));
            bVar1 = *(byte *)(CONCAT44(p.
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr._4_4_,
                                       p.
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr._0_4_) + 0x1dc);
            if ((bVar1 & 1) != 0) {
              psVar2 = req[9].log_entries_.
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if (psVar2 != (pointer)0x0) {
                iVar5 = (*(code *)(psVar2->
                                  super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr[1].buff_.
                                  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)();
                if (2 < iVar5) {
                  psVar2 = req[9].log_entries_.
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  msg_if_given_abi_cxx11_
                            (&local_a8,
                             "leave flag of server %d is set, but the server has not left yet",
                             (ulong)**(uint **)CONCAT44(p.
                                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  p.
                                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_));
                  (*(code *)(psVar2->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)
                            (psVar2,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                             ,"handle_rm_srv_req",0x18a,&local_a8);
                  std::__cxx11::string::~string((string *)&local_a8);
                }
              }
              *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffff6;
              bVar4 = true;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            _Var11._M_pi = extraout_RDX_07;
          } while ((bVar1 & 1) == 0);
          if (!bVar4) {
            this_01 = &this->super_enable_shared_from_this<nuraft::raft_server>;
LAB_001374bc:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
            _Var11._M_pi = extraout_RDX_16;
          }
        }
        else {
          psVar2 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (psVar2 != (pointer)0x0) {
            iVar5 = (*(code *)(psVar2->
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr[1].buff_.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ();
            _Var11._M_pi = extraout_RDX_05;
            if (2 < iVar5) {
              psVar2 = req[9].log_entries_.
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              msg_if_given_abi_cxx11_
                        (&local_a8,"previous to-be-removed server %d has not left yet",
                         (ulong)(uint)(((req[0xb].log_entries_.
                                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->term_);
              (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)(psVar2,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                               ,"handle_rm_srv_req",0x17e,&local_a8);
              std::__cxx11::string::~string((string *)&local_a8);
              _Var11._M_pi = extraout_RDX_06;
            }
          }
          *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffff6;
        }
      }
      else {
        psVar2 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar2 != (pointer)0x0) {
          iVar5 = (*(code *)(psVar2->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          _Var11._M_pi = extraout_RDX_00;
          if (2 < iVar5) {
            psVar2 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      (&local_a8,"this is not a leader, cannot handle RemoveServerRequest");
            (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar2,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_rm_srv_req",0x176,&local_a8);
            std::__cxx11::string::~string((string *)&local_a8);
            _Var11._M_pi = extraout_RDX_01;
          }
        }
        *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffd;
      }
      goto LAB_00136f96;
    }
  }
  psVar2 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (psVar2 != (pointer)0x0) {
    iVar5 = (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var11._M_pi = extraout_RDX_02;
    if (2 < iVar5) {
      psVar2 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_
                (&local_a8,
                 "bad remove server request as we are expecting one log entry with value type of int"
                );
      (*(code *)(psVar2->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar2,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                        ,"handle_rm_srv_req",0x170,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      _Var11._M_pi = extraout_RDX_03;
    }
  }
  *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffc;
LAB_00136f96:
  pVar14.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  pVar14.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar14.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_rm_srv_req(req_msg& req) {
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::remove_server_response,
                           id_,
                           leader_ );

    if (entries.size() != 1 || entries[0]->get_buf().size() != sz_int) {
        p_wn("bad remove server request as we are expecting "
             "one log entry with value type of int");
        resp->set_result_code(cmd_result_code::BAD_REQUEST);
        return resp;
    }

    if (role_ != srv_role::leader || write_paused_) {
        p_wn("this is not a leader, cannot handle RemoveServerRequest");
        resp->set_result_code(cmd_result_code::NOT_LEADER);
        return resp;
    }

    check_srv_to_leave_timeout();
    if (srv_to_leave_) {
        p_wn("previous to-be-removed server %d has not left yet",
             srv_to_leave_->get_id());
        resp->set_result_code(cmd_result_code::SERVER_IS_LEAVING);
        return resp;
    }
    // NOTE:
    //   Although `srv_to_leave_` is not set, we should check if
    //   there is any peer whose leave flag is set.
    for (auto& entry: peers_) {
        ptr<peer> pp = entry.second;
        if (pp->is_leave_flag_set()) {
            p_wn("leave flag of server %d is set, but the server "
                 "has not left yet",
                 pp->get_id());
            resp->set_result_code(cmd_result_code::SERVER_IS_LEAVING);
            return resp;
        }
    }

    if (config_changing_) {
        // the previous config has not committed yet
        p_wn("previous config has not committed yet");
        resp->set_result_code(cmd_result_code::CONFIG_CHANGING);
        return resp;
    }

    int32 srv_id = entries[0]->get_buf().get_int();
    if (srv_id == id_) {
        p_wn("cannot request to remove leader");
        resp->set_result_code(cmd_result_code::CANNOT_REMOVE_LEADER);
        return resp;
    }

    peer_itor pit = peers_.find(srv_id);
    if (pit == peers_.end()) {
        p_wn("server %d does not exist", srv_id);
        resp->set_result_code(cmd_result_code::SERVER_NOT_FOUND);
        return resp;
    }

    ptr<peer> p = pit->second;
    ptr<req_msg> leave_req( cs_new<req_msg>
                            ( state_->get_term(),
                              msg_type::leave_cluster_request,
                              id_, srv_id, 0,
                              log_store_->next_slot() - 1,
                              quick_commit_index_.load() ) );
    // WARNING:
    //   DO NOT reset HB counter to 0 as removing server
    //   may be requested multiple times, and anyway we should
    //   remove that server.
    p->set_leave_flag();

    if (p->make_busy()) {
        p->send_req(p, leave_req, ex_resp_handler_);
        p_in("sent leave request to peer %d", p->get_id());
    } else {
        p->set_rsv_msg(leave_req, ex_resp_handler_);
        p_in("peer %d is currently busy, keep the message", p->get_id());
    }

    resp->accept(log_store_->next_slot());
    return resp;
}